

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

xcb_rectangle_t monitor_clamp_client_rect(monitor *monitor,xcb_rectangle_t client_rect)

{
  int iVar1;
  int iVar2;
  int iVar3;
  xcb_rectangle_t xVar4;
  int32_t subtract_from_height;
  int32_t overflow_1;
  int32_t subtract_from_width;
  int32_t overflow;
  int32_t total_client_height;
  int32_t total_client_width;
  int32_t height;
  int32_t width;
  int32_t y;
  int32_t x;
  xcb_rectangle_t monitor_rect;
  monitor *monitor_local;
  xcb_rectangle_t client_rect_local;
  xcb_rectangle_t new_rect;
  
  xVar4 = monitor_get_offset_rect(monitor);
  monitor_local._0_2_ = client_rect.x;
  width._0_2_ = (uint16_t)monitor_local;
  monitor_local._2_2_ = client_rect.y;
  height._0_2_ = monitor_local._2_2_;
  monitor_local._4_2_ = client_rect.width;
  total_client_width._0_2_ = monitor_local._4_2_;
  monitor_local._6_2_ = client_rect.height;
  total_client_height._0_2_ = monitor_local._6_2_;
  iVar1 = ((int)(short)(uint16_t)monitor_local + (uint)monitor_local._4_2_) -
          (uint)(monitor->offsets).left;
  iVar2 = ((int)(short)monitor_local._2_2_ + (uint)monitor_local._6_2_) -
          (uint)(monitor->offsets).top;
  x._0_2_ = xVar4.width;
  if ((int)(uint)(ushort)x < iVar1) {
    iVar1 = iVar1 - (uint)(ushort)x;
    iVar3 = iVar1 - ((int)(short)(uint16_t)monitor_local - (uint)(monitor->offsets).left);
    if (iVar3 < 1) {
      width._0_2_ = (uint16_t)monitor_local - (short)iVar1;
    }
    else {
      width._0_2_ = (monitor->offsets).left;
      total_client_width._0_2_ = monitor_local._4_2_ - (short)iVar3;
    }
  }
  else if ((int)(short)(uint16_t)monitor_local < (int)(uint)(monitor->offsets).left) {
    width._0_2_ = (monitor->offsets).left;
  }
  x._2_2_ = xVar4.height;
  if ((int)(uint)x._2_2_ < iVar2) {
    iVar2 = iVar2 - (uint)x._2_2_;
    iVar1 = iVar2 - ((int)(short)monitor_local._2_2_ - (uint)(monitor->offsets).top);
    if (iVar1 < 1) {
      height._0_2_ = monitor_local._2_2_ - (short)iVar2;
    }
    else {
      height._0_2_ = (monitor->offsets).top;
      total_client_height._0_2_ = monitor_local._6_2_ - (short)iVar1;
    }
  }
  else if ((int)(short)monitor_local._2_2_ < (int)(uint)(monitor->offsets).top) {
    height._0_2_ = (monitor->offsets).top;
  }
  xVar4.y = (uint16_t)height;
  xVar4.x = (uint16_t)width;
  xVar4.width = (ushort)total_client_width;
  xVar4.height = (uint16_t)total_client_height;
  return xVar4;
}

Assistant:

xcb_rectangle_t monitor_clamp_client_rect(const struct monitor *monitor,
                                          xcb_rectangle_t client_rect)
{
        xcb_rectangle_t monitor_rect = monitor_get_offset_rect(monitor);

        int32_t x = client_rect.x;
        int32_t y = client_rect.y;
        int32_t width = client_rect.width;
        int32_t height = client_rect.height;
        int32_t total_client_width = client_rect.x + client_rect.width - monitor->offsets.left;
        int32_t total_client_height = client_rect.y + client_rect.height - monitor->offsets.top;

        if (total_client_width > monitor_rect.width) {
                int32_t overflow = total_client_width - monitor_rect.width;
                int32_t subtract_from_width = overflow - (client_rect.x - monitor->offsets.left);

                // If we don't have enough x offset to account for the overflow
                // we need to mutate the width of the client to fit onto the
                // monitor
                if (subtract_from_width > 0) {
                        x = monitor->offsets.left;
                        width = client_rect.width - subtract_from_width;
                } else {
                        x = client_rect.x - overflow;
                }
        } else if (client_rect.x < monitor->offsets.left) {
                x = monitor->offsets.left;
        }

        if (total_client_height > monitor_rect.height) {
                int32_t overflow = total_client_height - monitor_rect.height;
                int32_t subtract_from_height = overflow - (client_rect.y - monitor->offsets.top);

                if (subtract_from_height > 0) {
                        y = monitor->offsets.top;
                        height = client_rect.height - subtract_from_height;
                } else {
                        y = client_rect.y - overflow;
                }
        } else if (client_rect.y < monitor->offsets.top) {
                y = monitor->offsets.top;
        }

        xcb_rectangle_t new_rect = {
                .x = (int16_t)x,
                .y = (int16_t)y,
                .width = (uint16_t)width,
                .height = (uint16_t)height,
        };

        return new_rect;
}